

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ossl_set_engine(Curl_easy *data,char *engine)

{
  int iVar1;
  ulong error;
  char *pcVar2;
  char local_128 [8];
  char buf [256];
  ENGINE *e;
  char *engine_local;
  Curl_easy *data_local;
  
  buf._248_8_ = ENGINE_by_id(engine);
  if ((ENGINE *)buf._248_8_ == (ENGINE *)0x0) {
    Curl_failf(data,"SSL Engine \'%s\' not found",engine);
    data_local._4_4_ = CURLE_SSL_ENGINE_NOTFOUND;
  }
  else {
    if ((data->state).engine != (void *)0x0) {
      ENGINE_finish((ENGINE *)(data->state).engine);
      ENGINE_free((ENGINE *)(data->state).engine);
      (data->state).engine = (void *)0x0;
    }
    iVar1 = ENGINE_init((ENGINE *)buf._248_8_);
    if (iVar1 == 0) {
      ENGINE_free((ENGINE *)buf._248_8_);
      error = ERR_get_error();
      pcVar2 = ossl_strerror(error,local_128,0x100);
      Curl_failf(data,"Failed to initialise SSL Engine \'%s\':\n%s",engine,pcVar2);
      data_local._4_4_ = CURLE_SSL_ENGINE_INITFAILED;
    }
    else {
      (data->state).engine = (void *)buf._248_8_;
      data_local._4_4_ = CURLE_OK;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode Curl_ossl_set_engine(struct Curl_easy *data,
                                     const char *engine)
{
#ifdef USE_OPENSSL_ENGINE
  ENGINE *e;

#if OPENSSL_VERSION_NUMBER >= 0x00909000L
  e = ENGINE_by_id(engine);
#else
  /* avoid memory leak */
  for(e = ENGINE_get_first(); e; e = ENGINE_get_next(e)) {
    const char *e_id = ENGINE_get_id(e);
    if(!strcmp(engine, e_id))
      break;
  }
#endif

  if(!e) {
    failf(data, "SSL Engine '%s' not found", engine);
    return CURLE_SSL_ENGINE_NOTFOUND;
  }

  if(data->state.engine) {
    ENGINE_finish(data->state.engine);
    ENGINE_free(data->state.engine);
    data->state.engine = NULL;
  }
  if(!ENGINE_init(e)) {
    char buf[256];

    ENGINE_free(e);
    failf(data, "Failed to initialise SSL Engine '%s':\n%s",
          engine, ossl_strerror(ERR_get_error(), buf, sizeof(buf)));
    return CURLE_SSL_ENGINE_INITFAILED;
  }
  data->state.engine = e;
  return CURLE_OK;
#else
  (void)engine;
  failf(data, "SSL Engine not supported");
  return CURLE_SSL_ENGINE_NOTFOUND;
#endif
}